

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_CodeLocation.cpp
# Opt level: O3

CodeLocation __thiscall
soul::CodeLocation::createFromString(CodeLocation *this,string *filename,string *text)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  UTF8Reader extraout_RDX;
  CodeLocation CVar2;
  Ptr local_68;
  string local_60;
  string local_40;
  
  local_60._M_dataplus._M_p = (filename->_M_dataplus)._M_p;
  paVar1 = &filename->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p == paVar1) {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_60.field_2._8_8_ = *(undefined8 *)((long)&filename->field_2 + 8);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  }
  else {
    local_60.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60._M_string_length = filename->_M_string_length;
  (filename->_M_dataplus)._M_p = (pointer)paVar1;
  filename->_M_string_length = 0;
  (filename->field_2)._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (text->_M_dataplus)._M_p;
  paVar1 = &text->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p == paVar1) {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_40.field_2._8_8_ = *(undefined8 *)((long)&text->field_2 + 8);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_40._M_string_length = text->_M_string_length;
  (text->_M_dataplus)._M_p = (pointer)paVar1;
  text->_M_string_length = 0;
  (text->field_2)._M_local_buf[0] = '\0';
  SourceCodeText::createForFile((SourceCodeText *)&local_68,&local_60,&local_40);
  CodeLocation(this,&local_68);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  validateUTF8(this);
  CVar2.location.data = extraout_RDX.data;
  CVar2.sourceCode.object = (SourceCodeText *)this;
  return CVar2;
}

Assistant:

CodeLocation CodeLocation::createFromString (std::string filename, std::string text)
{
    CodeLocation code (SourceCodeText::createForFile (std::move (filename), std::move (text)));
    code.validateUTF8();
    return code;
}